

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::getdashorder(Forth *this)

{
  uint *puVar1;
  uint *puVar2;
  
  requireDStackAvailable
            (this,((long)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) + 1,"GET-ORDER");
  puVar1 = (uint *)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar2 = (uint *)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    ForthStack<unsigned_int>::push(&this->dStack,*puVar2);
  }
  ForthStack<unsigned_int>::push
            (&this->dStack,
             (uint)((ulong)((long)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->searchOrder).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
  return;
}

Assistant:

void getdashorder(){
			REQUIRE_DSTACK_AVAILABLE(searchOrder.size()+1, "GET-ORDER");
			for(auto i : searchOrder ){
				dStack.push(i); 
			}
			dStack.push(CELL(searchOrder.size())); 
		}